

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PassThrough.cpp
# Opt level: O1

void __thiscall PassThrough::handleEvent(PassThrough *this,Event *e)

{
  if (e->type != Spike) {
    this->eventType = No;
    return;
  }
  this->eventType = Spike;
  this->multiplicity = *(int *)&e[1]._vptr_Event;
  this->weight = *(double *)&e[1].type;
  return;
}

Assistant:

void PassThrough::handleEvent(Event* e) {
    if(e->type == EventType::Spike) {
        eventType = EventType::Spike;
        multiplicity = static_cast<SpikeEvent*>(e)->multiplicity;
        weight = static_cast<SpikeEvent*>(e)->weight;
    }
    else {
        eventType = EventType::No;
    }
}